

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

cmSourceFile * __thiscall
cmLocalGenerator::LinearGetSourceFileWithOutput
          (cmLocalGenerator *this,string *name,cmSourceOutputKind kind,bool *byproduct)

{
  pointer puVar1;
  bool bVar2;
  bool bVar3;
  cmCustomCommand *pcVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar5;
  unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_> *src;
  pointer puVar6;
  cmSourceFile *unaff_R14;
  bool bVar7;
  cmSourceFile *local_48;
  
  *byproduct = false;
  puVar6 = (this->Makefile->SourceFiles).
           super__Vector_base<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->Makefile->SourceFiles).
           super__Vector_base<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar7 = puVar6 == puVar1;
  if (bVar7) {
    local_48 = (cmSourceFile *)0x0;
  }
  else {
    local_48 = (cmSourceFile *)0x0;
    do {
      pcVar4 = cmSourceFile::GetCustomCommand
                         ((puVar6->_M_t).
                          super___uniq_ptr_impl<cmSourceFile,_std::default_delete<cmSourceFile>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_cmSourceFile_*,_std::default_delete<cmSourceFile>_>
                          .super__Head_base<0UL,_cmSourceFile_*,_false>._M_head_impl);
      bVar2 = true;
      if (pcVar4 != (cmCustomCommand *)0x0) {
        pcVar4 = cmSourceFile::GetCustomCommand
                           ((puVar6->_M_t).
                            super___uniq_ptr_impl<cmSourceFile,_std::default_delete<cmSourceFile>_>.
                            _M_t.
                            super__Tuple_impl<0UL,_cmSourceFile_*,_std::default_delete<cmSourceFile>_>
                            .super__Head_base<0UL,_cmSourceFile_*,_false>._M_head_impl);
        pvVar5 = cmCustomCommand::GetOutputs_abi_cxx11_(pcVar4);
        bVar3 = anon_unknown.dwarf_adf2b6::AnyOutputMatches(name,pvVar5);
        if (bVar3) {
          unaff_R14 = (puVar6->_M_t).
                      super___uniq_ptr_impl<cmSourceFile,_std::default_delete<cmSourceFile>_>._M_t.
                      super__Tuple_impl<0UL,_cmSourceFile_*,_std::default_delete<cmSourceFile>_>.
                      super__Head_base<0UL,_cmSourceFile_*,_false>._M_head_impl;
          bVar2 = false;
        }
        else if (kind == OutputOrByproduct) {
          pcVar4 = cmSourceFile::GetCustomCommand
                             ((puVar6->_M_t).
                              super___uniq_ptr_impl<cmSourceFile,_std::default_delete<cmSourceFile>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cmSourceFile_*,_std::default_delete<cmSourceFile>_>
                              .super__Head_base<0UL,_cmSourceFile_*,_false>._M_head_impl);
          pvVar5 = cmCustomCommand::GetByproducts_abi_cxx11_(pcVar4);
          bVar3 = anon_unknown.dwarf_adf2b6::AnyOutputMatches(name,pvVar5);
          if (bVar3) {
            local_48 = (puVar6->_M_t).
                       super___uniq_ptr_impl<cmSourceFile,_std::default_delete<cmSourceFile>_>._M_t.
                       super__Tuple_impl<0UL,_cmSourceFile_*,_std::default_delete<cmSourceFile>_>.
                       super__Head_base<0UL,_cmSourceFile_*,_false>._M_head_impl;
          }
        }
      }
      if (!bVar2) break;
      puVar6 = puVar6 + 1;
      bVar7 = puVar6 == puVar1;
    } while (!bVar7);
  }
  if (bVar7) {
    *byproduct = local_48 != (cmSourceFile *)0x0;
    unaff_R14 = local_48;
  }
  return unaff_R14;
}

Assistant:

cmSourceFile* cmLocalGenerator::LinearGetSourceFileWithOutput(
  const std::string& name, cmSourceOutputKind kind, bool& byproduct) const
{
  // Outputs take precedence over byproducts.
  byproduct = false;
  cmSourceFile* fallback = nullptr;

  // Look through all the source files that have custom commands and see if the
  // custom command has the passed source file as an output.
  for (const auto& src : this->Makefile->GetSourceFiles()) {
    // Does this source file have a custom command?
    if (src->GetCustomCommand()) {
      // Does the output of the custom command match the source file name?
      if (AnyOutputMatches(name, src->GetCustomCommand()->GetOutputs())) {
        // Return the first matching output.
        return src.get();
      }
      if (kind == cmSourceOutputKind::OutputOrByproduct) {
        if (AnyOutputMatches(name, src->GetCustomCommand()->GetByproducts())) {
          // Do not return the source yet as there might be a matching output.
          fallback = src.get();
        }
      }
    }
  }

  // Did we find a byproduct?
  byproduct = fallback != nullptr;
  return fallback;
}